

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O3

bool __thiscall lexical::analyse_char(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  char *ch;
  int iVar6;
  Token t;
  string buf;
  int local_b4;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  Symbol local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  ch = it->_M_current;
  bVar5 = false;
  if (ch != (m->end)._M_current) {
    local_b4 = 0;
    iVar6 = 0;
    do {
      switch(bVar5) {
      case 0:
        bVar5 = 1;
        break;
      case 1:
        cVar2 = *ch;
        std::__cxx11::string::push_back((char)&local_78);
        bVar5 = cVar2 == '\\' | 2;
        break;
      case 2:
        bVar5 = 6;
        if (*ch != '\'') {
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,anon_var_dwarf_31fd1,anon_var_dwarf_31fd1 + 0x15);
          error(this,it,m,(string *)local_a8);
LAB_0010b909:
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_);
          }
          goto LAB_0010b736;
        }
        break;
      case 3:
        std::__cxx11::string::push_back((char)&local_78);
        bVar3 = Table::in_escape_chars(&this->table,it->_M_current);
        bVar5 = 2;
        if (!bVar3) {
          bVar5 = 4;
          if (*it->_M_current != 'u') {
            bVar3 = sutil::is_octal(it->_M_current);
            if (bVar3) {
              it->_M_current = it->_M_current + -1;
              std::__cxx11::string::pop_back();
              goto LAB_0010b6f1;
            }
            local_a8._0_8_ = local_a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,anon_var_dwarf_31fe8,anon_var_dwarf_31fe8 + 0x15);
            error(this,it,m,(string *)local_a8);
            goto LAB_0010b909;
          }
        }
        break;
      case 4:
        if (iVar6 < 4) {
          iVar4 = isxdigit((int)*ch);
          if (iVar4 == 0) {
            local_a8._0_8_ = local_a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,anon_var_dwarf_31ff3,anon_var_dwarf_31ff3 + 0x25);
            error(this,it,m,(string *)local_a8);
            goto LAB_0010b909;
          }
          bVar5 = 4;
          std::__cxx11::string::push_back((char)&local_78);
          iVar6 = iVar6 + 1;
        }
        else {
          it->_M_current = ch + -1;
          bVar5 = 2;
          iVar6 = iVar6 + 1;
        }
        break;
      case 5:
        if (local_b4 < 3) {
          bVar3 = sutil::is_octal(ch);
          if (bVar3) {
            std::__cxx11::string::push_back((char)&local_78);
            local_b4 = local_b4 + 1;
LAB_0010b6f1:
            bVar5 = 5;
            break;
          }
          if (local_b4 == 0) {
            local_a8._0_8_ = local_a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,anon_var_dwarf_3200a,anon_var_dwarf_3200a + 0x27);
            error(this,it,m,(string *)local_a8);
            goto LAB_0010b909;
          }
          it->_M_current = it->_M_current + -1;
        }
        else {
          it->_M_current = ch + -1;
        }
        bVar5 = 2;
        break;
      case 6:
        Token::Token((Token *)local_a8,m->line,m->column,7,&local_78);
        std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_a8);
        paVar1 = &local_58.name.field_2;
        local_58.type = local_a8._8_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._16_8_ == &local_88) {
          local_58.name.field_2._8_8_ = local_88._8_8_;
          local_58.name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_58.name._M_dataplus._M_p = (pointer)local_a8._16_8_;
        }
        local_58.name._M_string_length = local_a8._24_8_;
        local_a8._24_8_ = 0;
        local_88._M_local_buf[0] = '\0';
        local_a8._16_8_ = &local_88;
        std::
        _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
        ::_M_insert_unique<Symbol>(&(this->symbols)._M_t,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._16_8_ != &local_88) {
          operator_delete((void *)local_a8._16_8_);
        }
        bVar5 = true;
        goto LAB_0010b738;
      }
      ch = it->_M_current + 1;
      it->_M_current = ch;
    } while (ch != (m->end)._M_current);
LAB_0010b736:
    bVar5 = false;
  }
LAB_0010b738:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return (bool)bVar5;
}

Assistant:

bool lexical::analyse_char(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    int countU = 0;
    int countO = 0;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (*it == '\\')
                    state = 3;
                else
                    state = 2;
                buf.push_back(*it);
                break;
            }
                //分析普通字符
            case 2: {
                if (*it != '\'') {
                    error(it, m, "非法的字符结尾");
                    return false;
                }
                state = 6;
                break;
            }
                //分析普通转义字符
            case 3: {
                buf.push_back(*it);
                if (table.in_escape_chars(*it)) {
                    state = 2;
                } else if (*it == 'u') {
                    state = 4;
                } else if (sutil::is_octal(*it)) {
                    state = 5;
                    --it;
                    buf.pop_back();
                } else {
                    error(it, m, "非法的转义字符");
                    return false;
                }
                break;
            }
                // 分析\uFFFF
            case 4: {
                if (countU++ < 4) {
                    if (isxdigit(*it))buf.push_back(*it);
                    else {
                        error(it, m, "unicode表示法需要4位16进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
                //分析 \八进制*3
            case 5: {
                if (countO < 3) {
                    if (sutil::is_octal(*it)) {
                        ++countO;
                        buf.push_back(*it);
                    } else if (countO != 0) {
                        --it;
                        state = 2;
                    } else {
                        error(it, m, "八进制字符需要1-3位八进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 6: {
                Token t(m.line, m.column, Token::CHAR, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}